

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O2

void __thiscall CEExecOptions::AddCorrFilePars(CEExecOptions *this)

{
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_88,"nutation",&local_a9);
  std::__cxx11::string::string((string *)&local_a8,"File containing nutation corrections",&local_aa)
  ;
  std::__cxx11::string::string((string *)&local_28,"",&local_ab);
  CLOptions::AddStringParam(&this->super_CLOptions,&local_88,&local_a8,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"ttut1hist",&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"File containing \'TT - UT1\' corrections (historical)",&local_aa);
  std::__cxx11::string::string((string *)&local_48,"",&local_ab);
  CLOptions::AddStringParam(&this->super_CLOptions,&local_88,&local_a8,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"ttut1pred",&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"File containing \'TT - UT1\' corrections (predicted)",&local_aa);
  std::__cxx11::string::string((string *)&local_68,"",&local_ab);
  CLOptions::AddStringParam(&this->super_CLOptions,&local_88,&local_a8,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

inline
void CEExecOptions::AddCorrFilePars(void)
{
    AddStringParam("nutation", "File containing nutation corrections",
                   "");
    AddStringParam("ttut1hist", "File containing 'TT - UT1' corrections (historical)",
                   "");
    AddStringParam("ttut1pred", "File containing 'TT - UT1' corrections (predicted)",
                   "");
}